

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

bool SHA1_ValidateHelper(char *str,ON__UINT8 *standard)

{
  int iVar1;
  int iVar2;
  ON__UINT64 OVar3;
  bool local_106;
  bool local_105;
  undefined1 local_104 [8];
  ON_SHA1_Hash sha1_digest1;
  ON_SHA1_Hash local_dc;
  int local_c8;
  int local_c4;
  int j;
  int i;
  bool rc;
  ON_SHA1_Hash sha1_digest;
  ON_SHA1 sha1;
  int str_length;
  ON__UINT8 *standard_local;
  char *str_local;
  
  iVar1 = ON_String::Length(str);
  ON_SHA1::ON_SHA1((ON_SHA1 *)(sha1_digest.m_digest + 0xc));
  ON_SHA1::AccumulateBytes((ON_SHA1 *)(sha1_digest.m_digest + 0xc),str,(long)iVar1);
  ON_SHA1::Hash((ON_SHA1_Hash *)&i,(ON_SHA1 *)(sha1_digest.m_digest + 0xc));
  iVar2 = memcmp(standard,&i,0x14);
  if (iVar2 == 0) {
    j._3_1_ = true;
    local_c4 = 0;
    while( true ) {
      local_105 = false;
      if (local_c4 <= iVar1) {
        local_105 = (bool)j._3_1_;
      }
      if (local_105 == false) break;
      local_c8 = 0;
      while( true ) {
        local_106 = false;
        if (local_c4 + local_c8 <= iVar1) {
          local_106 = (bool)j._3_1_;
        }
        if (local_106 == false) break;
        ON_SHA1::Reset((ON_SHA1 *)(sha1_digest.m_digest + 0xc));
        ON_SHA1::AccumulateBytes((ON_SHA1 *)(sha1_digest.m_digest + 0xc),str,(long)local_c4);
        ON_SHA1::Hash(&local_dc,(ON_SHA1 *)(sha1_digest.m_digest + 0xc));
        ON_SHA1::AccumulateBytes
                  ((ON_SHA1 *)(sha1_digest.m_digest + 0xc),str + local_c4,(long)local_c8);
        ON_SHA1::Hash((ON_SHA1_Hash *)(sha1_digest1.m_digest + 0xc),
                      (ON_SHA1 *)(sha1_digest.m_digest + 0xc));
        ON_SHA1::AccumulateBytes
                  ((ON_SHA1 *)(sha1_digest.m_digest + 0xc),str + (long)local_c8 + (long)local_c4,
                   (long)((iVar1 - local_c4) - local_c8));
        ON_SHA1::Hash((ON_SHA1_Hash *)local_104,(ON_SHA1 *)(sha1_digest.m_digest + 0xc));
        j._3_1_ = operator==((ON_SHA1_Hash *)&i,(ON_SHA1_Hash *)local_104);
        local_c8 = local_c8 + 1;
      }
      local_c4 = local_c4 + 1;
    }
    if (((bool)j._3_1_ != false) &&
       (OVar3 = ON_SHA1::ByteCount((ON_SHA1 *)(sha1_digest.m_digest + 0xc)), (long)iVar1 != OVar3))
    {
      j._3_1_ = 0;
    }
    str_local._7_1_ = (bool)(j._3_1_ & 1);
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

static bool SHA1_ValidateHelper(
  const char* str,
  const ON__UINT8 standard[20]
  )
{
  const int str_length = ON_String::Length(str);
  ON_SHA1 sha1;
  sha1.AccumulateBytes(str, str_length);
  const ON_SHA1_Hash sha1_digest(sha1.Hash());
  if ( 0 != memcmp(standard, &sha1_digest, 20) )
    return false;

  bool rc = true;
  for (int i = 0; i <= str_length && rc; i++)
  {
    for (int j = 0; i+j <= str_length && rc; j++)
    {
      sha1.Reset();
      sha1.AccumulateBytes(str, i);
      sha1.Hash();
      sha1.AccumulateBytes(str+i, j);
      sha1.Hash();
      sha1.AccumulateBytes(str+i+j, str_length-i-j);
      ON_SHA1_Hash sha1_digest1(sha1.Hash());
      rc = ( sha1_digest == sha1_digest1 );
    }
  }

  if (rc)
  {
    if ( (ON__UINT64)str_length != sha1.ByteCount() )
      rc = false;
  }

  return rc;
}